

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O2

AggregateFunction * duckdb::GetApproxQuantileDecimalList(void)

{
  AggregateFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_a9;
  LogicalType local_a8;
  LogicalType local_90;
  LogicalType local_78;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_60;
  LogicalType local_48 [2];
  
  LogicalType::LogicalType(local_48,DECIMAL);
  LogicalType::LogicalType(&local_78,FLOAT);
  LogicalType::LIST(local_48 + 1,&local_78);
  __l._M_len = 2;
  __l._M_array = local_48;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_60,__l,&local_a9);
  LogicalType::LogicalType(&local_a8,DECIMAL);
  LogicalType::LIST(&local_90,&local_a8);
  AggregateFunction::AggregateFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_60,&local_90,(aggregate_size_t)0x0,
             (aggregate_initialize_t)0x0,(aggregate_update_t)0x0,(aggregate_combine_t)0x0,
             (aggregate_finalize_t)0x0,(aggregate_simple_update_t)0x0,BindApproxQuantileDecimalList,
             (aggregate_destructor_t)0x0,(aggregate_statistics_t)0x0,(aggregate_window_t)0x0,
             (aggregate_serialize_t)0x0,(aggregate_deserialize_t)0x0);
  LogicalType::~LogicalType(&local_90);
  LogicalType::~LogicalType(&local_a8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_60);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_48[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::~LogicalType(&local_78);
  in_RDI->serialize = ApproximateQuantileBindData::Serialize;
  in_RDI->deserialize = ApproxQuantileDecimalDeserialize;
  return in_RDI;
}

Assistant:

AggregateFunction GetApproxQuantileDecimalList() {
	// stub function - the actual function is set during bind or deserialize
	AggregateFunction fun({LogicalTypeId::DECIMAL, LogicalType::LIST(LogicalType::FLOAT)},
	                      LogicalType::LIST(LogicalTypeId::DECIMAL), nullptr, nullptr, nullptr, nullptr, nullptr,
	                      nullptr, BindApproxQuantileDecimalList);
	fun.serialize = ApproximateQuantileBindData::Serialize;
	fun.deserialize = ApproxQuantileDecimalDeserialize;
	return fun;
}